

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

void __thiscall FfsParser::FfsParser(FfsParser *this,TreeModel *treeModel)

{
  FitParser *this_00;
  NvramParser *this_01;
  MeParser *this_02;
  TreeModel *treeModel_local;
  FfsParser *this_local;
  
  this->model = treeModel;
  std::vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>::
  vector(&this->messagesVector);
  QByteArray::QByteArray(&this->openedImage);
  QModelIndex::QModelIndex(&this->lastVtf);
  this->imageBase = 0;
  this->addressDiff = 0x100000000;
  QString::QString(&this->securityInfo);
  std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::vector(&this->protectedRanges);
  this->protectedRegionsBase = 0;
  QModelIndex::QModelIndex(&this->dxeCore);
  this_00 = (FitParser *)operator_new(0xa8);
  FitParser::FitParser(this_00,treeModel,this);
  this->fitParser = this_00;
  this_01 = (NvramParser *)operator_new(0x28);
  NvramParser::NvramParser(this_01,treeModel,this);
  this->nvramParser = this_01;
  this_02 = (MeParser *)operator_new(0x28);
  MeParser::MeParser(this_02,treeModel,this);
  this->meParser = this_02;
  return;
}

Assistant:

FfsParser::FfsParser(TreeModel* treeModel) : model(treeModel),
imageBase(0), addressDiff(0x100000000ULL), protectedRegionsBase(0) {
    fitParser = new FitParser(treeModel, this);
    nvramParser = new NvramParser(treeModel, this);
    meParser = new MeParser(treeModel, this);
}